

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:189:44),_kj::Promise<void>_>
* __thiscall
kj::mvCapture<kj::(anonymous_namespace)::TestCase181::run()::__0,kj::Promise<void>&>
          (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:189:44),_kj::Promise<void>_>
           *__return_storage_ptr__,kj *this,Promise<void> *param,Type *func)

{
  Type *func_00;
  Promise<void> *param_00;
  Type *func_local;
  Promise<void> *param_local;
  
  func_00 = fwd<kj::(anonymous_namespace)::TestCase181::run()::__0>
                      ((NoInfer<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:189:44)>
                        *)param);
  param_00 = mv<kj::Promise<void>>((Promise<void> *)this);
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:189:44),_kj::Promise<void>_>
  ::CaptureByMove(__return_storage_ptr__,func_00,param_00);
  return __return_storage_ptr__;
}

Assistant:

inline CaptureByMove<Func, Decay<MovedParam>> mvCapture(MovedParam&& param, Func&& func) {
  // Hack to create a "lambda" which captures a variable by moving it rather than copying or
  // referencing.  C++14 generalized captures should make this obsolete, but for now in C++11 this
  // is commonly needed for Promise continuations that own their state.  Example usage:
  //
  //    Own<Foo> ptr = makeFoo();
  //    Promise<int> promise = callRpc();
  //    promise.then(mvCapture(ptr, [](Own<Foo>&& ptr, int result) {
  //      return ptr->finish(result);
  //    }));

  return CaptureByMove<Func, Decay<MovedParam>>(kj::fwd<Func>(func), kj::mv(param));
}